

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

void __thiscall World::increaseSpeed(World *this)

{
  long lVar1;
  ostream *poVar2;
  float fVar3;
  float fVar4;
  
  if (this->gameSpeed < 0x4001) {
    lVar1 = this->gameSpeed * 2;
    this->gameSpeed = lVar1;
    fVar4 = (float)lVar1;
    fVar3 = truncf(this->gameTime * fVar4 * 0.0078125);
    this->lastGravityUpdate = (long)fVar3;
    fVar3 = fVar4 * 100.0 * 0.0078125;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"game speed is now ",0x12);
    poVar2 = std::ostream::_M_insert<double>((double)fVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
    poVar2 = std::ostream::_M_insert<double>((double)(fVar3 / 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"x)",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void World::increaseSpeed() {
    if (gameSpeed * 2 <= 32768) {
        gameSpeed *= 2;
        lastGravityUpdate = trunc((gameTime * gameSpeed) / 128);
        float speedPercentage = 100.f * gameSpeed / 128;
        cout << "game speed is now " << speedPercentage << " (" << speedPercentage / 100 << "x)" << endl;
    }
}